

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O1

Rect __thiscall lunasvg::SVGElement::paintBoundingBox(SVGElement *this)

{
  Rect *this_00;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined8 uVar1;
  Rect RVar2;
  Rect local_28;
  
  this_00 = &this->m_paintBoundingBox;
  uVar1 = 0;
  if (((this->m_paintBoundingBox).w < 0.0) || ((this->m_paintBoundingBox).h < 0.0)) {
    this_00->x = 0.0;
    (this->m_paintBoundingBox).y = 0.0;
    (this->m_paintBoundingBox).w = 0.0;
    (this->m_paintBoundingBox).h = 0.0;
    (*(this->super_SVGNode)._vptr_SVGNode[0xc])(this);
    (this->m_paintBoundingBox).x = extraout_XMM0_Da;
    (this->m_paintBoundingBox).y = extraout_XMM0_Db;
    (this->m_paintBoundingBox).w = (float)uVar1;
    (this->m_paintBoundingBox).h = (float)((ulong)uVar1 >> 0x20);
    if (((this->m_paintBoundingBox).w < 0.0) || ((this->m_paintBoundingBox).h < 0.0)) {
      __assert_fail("m_paintBoundingBox.isValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgelement.cpp"
                    ,0x141,"virtual Rect lunasvg::SVGElement::paintBoundingBox() const");
    }
    if (this->m_clipper != (SVGClipPathElement *)0x0) {
      local_28 = SVGClipPathElement::clipBoundingBox(this->m_clipper,this);
      RVar2 = Rect::intersected(this_00,&local_28);
      this->m_paintBoundingBox = RVar2;
    }
    if (this->m_masker != (SVGMaskElement *)0x0) {
      local_28 = SVGMaskElement::maskBoundingBox(this->m_masker,this);
      RVar2 = Rect::intersected(this_00,&local_28);
      this->m_paintBoundingBox = RVar2;
    }
  }
  return *this_00;
}

Assistant:

Rect SVGElement::paintBoundingBox() const
{
    if(m_paintBoundingBox.isValid())
        return m_paintBoundingBox;
    m_paintBoundingBox = Rect::Empty;
    m_paintBoundingBox = strokeBoundingBox();
    assert(m_paintBoundingBox.isValid());
    if(m_clipper) m_paintBoundingBox.intersect(m_clipper->clipBoundingBox(this));
    if(m_masker) m_paintBoundingBox.intersect(m_masker->maskBoundingBox(this));
    return m_paintBoundingBox;
}